

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

FormalArgumentSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::ArgumentDirection&,slang::ast::VariableLifetime>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,ArgumentDirection *args_2,VariableLifetime *args_3)

{
  string_view name;
  FormalArgumentSymbol *this_00;
  
  this_00 = (FormalArgumentSymbol *)allocate(this,0x178,8);
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::FormalArgumentSymbol::FormalArgumentSymbol(this_00,name,*args_1,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }